

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test1DLinearResource_Test::TestBody
          (CTestGen9Resource_Test1DLinearResource_Test *this)

{
  int iVar1;
  CTestGen9Resource_Test1DLinearResource_Test *pCVar2;
  GMM_RESOURCE_INFO *pGVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  CTestGen9Resource_Test1DLinearResource_Test *local_38;
  
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_90 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_40 = 0;
  local_b8 = 1;
  local_50 = 0x100000000;
  local_a8 = 0x80000;
  local_b0 = 0x400000000;
  piVar6 = &DAT_001a7e58;
  lVar5 = 0;
  local_38 = this;
  do {
    local_b4 = *(undefined4 *)((long)&DAT_001a7f2c + lVar5);
    uStack_88 = 1;
    local_80 = CONCAT44(local_80._4_4_,1);
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8);
    pCVar2 = local_38;
    uVar4 = (int)uStack_88 + 0x3f;
    iVar1 = *piVar6;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_38,pGVar3,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)pCVar2,pGVar3,
               (ulong)((uVar4 & 0xffffffc0) * iVar1 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    piVar6 = piVar6 + 2;
    lVar5 = lVar5 + 4;
  } while ((int)lVar5 != 0x14);
  piVar6 = &DAT_001a7e58;
  lVar5 = 0;
  do {
    local_b4 = *(undefined4 *)((long)&DAT_001a7f2c + lVar5);
    uStack_88 = 0x1001;
    local_80 = CONCAT44(local_80._4_4_,1);
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8);
    pCVar2 = local_38;
    uVar4 = (int)uStack_88 + 0x3f;
    iVar1 = *piVar6;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_38,pGVar3,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)pCVar2,pGVar3,
               (ulong)((uVar4 & 0xffffffc0) * iVar1 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    piVar6 = piVar6 + 2;
    lVar5 = lVar5 + 4;
  } while ((int)lVar5 != 0x14);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResource)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }


    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1001;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}